

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntaxAnalysis.cpp
# Opt level: O2

int constDefine(function *fn)

{
  if (Token == INTTK) {
    do {
      constDefineInt(fn);
    } while (Token == COMMA);
  }
  else if (Token == CHARTK) {
    do {
      constDefineChar(fn);
    } while (Token == COMMA);
  }
  retractTokens(1);
  return 1;
}

Assistant:

int constDefine(function &fn) {//常量定义
    if (Token == INTTK) {
        constDefineInt(fn);
        while (Token == COMMA) {
            constDefineInt(fn);
        }
    } else if (Token == CHARTK) {
        constDefineChar(fn);
        while (Token == COMMA) {
            constDefineChar(fn);
        }
    } else {}//impossible to reach
    retractTokens(1);
    //outputAns.emplace_back(syntaxCategoryString[3]);
    return 1;
}